

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::scgi::scgi(scgi *this,service *srv)

{
  io_service *piVar1;
  service *in_RDI;
  connection *unaff_retaddr;
  
  connection::connection(unaff_retaddr,in_RDI);
  (in_RDI->impl_).ptr_ = (service *)&PTR__scgi_00530a20;
  in_RDI[0x20].impl_.ptr_ = (service *)0x0;
  in_RDI[0x21].impl_.ptr_ = (service *)0x0;
  cppcms::service::impl((service *)0x4949b0);
  piVar1 = service::get_io_service((service *)0x4949c1);
  booster::aio::stream_socket::stream_socket((stream_socket *)(in_RDI + 0x23),piVar1);
  std::__cxx11::string::string((string *)(in_RDI + 0x29));
  *(undefined1 *)&in_RDI[0x2d].impl_.ptr_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x494a02);
  *(undefined1 *)&in_RDI[0x31].impl_.ptr_ = 0;
  return;
}

Assistant:

scgi(cppcms::service &srv) :
			connection(srv),
			start_(0),
			end_(0),
			socket_(srv.impl().get_io_service()),
			headers_written_(false),
			eof_callback_(false)
		{
		}